

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::NormalGetFullPath
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact,bool realname)

{
  bool bVar1;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  undefined1 local_26;
  byte local_25;
  ArtifactType local_24;
  bool realname_local;
  string *psStack_20;
  ArtifactType artifact_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  string *fpath;
  
  local_26 = 0;
  local_25 = realname;
  local_24 = artifact;
  psStack_20 = config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  GetDirectory(__return_storage_ptr__,this,config,artifact);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  bVar1 = IsAppBundleOnApple(this);
  if (bVar1) {
    BuildBundleDirectory(&local_58,this,__return_storage_ptr__,psStack_20,FullLevel);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  }
  if (local_24 == RuntimeBinaryArtifact) {
    if ((local_25 & 1) == 0) {
      GetFullName(&local_98,this,psStack_20,RuntimeBinaryArtifact);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
    else {
      NormalGetRealName(&local_78,this,psStack_20);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  else if (local_24 == ImportLibraryArtifact) {
    GetFullName(&local_b8,this,psStack_20,ImportLibraryArtifact);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::NormalGetFullPath(
  const std::string& config, cmStateEnums::ArtifactType artifact,
  bool realname) const
{
  std::string fpath = this->GetDirectory(config, artifact);
  fpath += "/";
  if (this->IsAppBundleOnApple()) {
    fpath = this->BuildBundleDirectory(fpath, config, FullLevel);
    fpath += "/";
  }

  // Add the full name of the target.
  switch (artifact) {
    case cmStateEnums::RuntimeBinaryArtifact:
      if (realname) {
        fpath += this->NormalGetRealName(config);
      } else {
        fpath +=
          this->GetFullName(config, cmStateEnums::RuntimeBinaryArtifact);
      }
      break;
    case cmStateEnums::ImportLibraryArtifact:
      fpath += this->GetFullName(config, cmStateEnums::ImportLibraryArtifact);
      break;
  }
  return fpath;
}